

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger_recorders.cpp
# Opt level: O0

unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
MakeDebugUtilsLoaderLogRecorder
          (XrDebugUtilsMessengerCreateInfoEXT *create_info,XrDebugUtilsMessengerEXT debug_messenger)

{
  DebugUtilsLogRecorder *this;
  XrDebugUtilsMessengerEXT in_RDX;
  XrDebugUtilsMessengerEXT debug_messenger_local;
  XrDebugUtilsMessengerCreateInfoEXT *create_info_local;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  
  this = (DebugUtilsLogRecorder *)operator_new(0x38);
  anon_unknown.dwarf_5e6fc::DebugUtilsLogRecorder::DebugUtilsLogRecorder
            (this,(XrDebugUtilsMessengerCreateInfoEXT *)debug_messenger,in_RDX);
  std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>::
  unique_ptr<std::default_delete<LoaderLogRecorder>,void>
            ((unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>> *)create_info,
             (pointer)this);
  return (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         create_info;
}

Assistant:

std::unique_ptr<LoaderLogRecorder> MakeDebugUtilsLoaderLogRecorder(const XrDebugUtilsMessengerCreateInfoEXT* create_info,
                                                                   XrDebugUtilsMessengerEXT debug_messenger) {
    std::unique_ptr<LoaderLogRecorder> recorder(new DebugUtilsLogRecorder(create_info, debug_messenger));
    return recorder;
}